

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCCompatible.cpp
# Opt level: O2

void __thiscall
PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context::
Context(Context *this,PIT *pit,DMA *dma,PPI *ppi,PIC *pic,type *card,FloppyController *fdc,RTC *rtc)

{
  Registers *pRVar1;
  
  pRVar1 = &this->registers;
  (this->segments).registers_ = pRVar1;
  memset(&this->memory,0,0x100000);
  (this->memory).memory._M_elems[0] = 0xff;
  (this->memory).registers_ = pRVar1;
  (this->memory).segments_ = &this->segments;
  (this->memory).write_back_address_[0] = 0;
  (this->memory).write_back_address_[1] = 0;
  (this->flow_controller).registers_ = pRVar1;
  (this->flow_controller).segments_ = &this->segments;
  (this->flow_controller).should_repeat_ = false;
  (this->flow_controller).halted_ = false;
  (this->io).pit_ = pit;
  (this->io).dma_ = dma;
  (this->io).ppi_ = ppi;
  (this->io).pic_ = pic;
  (this->io).video_ = card;
  (this->io).fdc_ = fdc;
  (this->io).rtc_ = rtc;
  reset(this);
  return;
}

Assistant:

Context(PIT &pit, DMA &dma, PPI &ppi, PIC &pic, typename Adaptor<video>::type &card, FloppyController &fdc, RTC &rtc) :
				segments(registers),
				memory(registers, segments),
				flow_controller(registers, segments),
				io(pit, dma, ppi, pic, card, fdc, rtc)
			{
				reset();
			}